

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_encode_init(aec_stream *strm)

{
  internal_state *__s;
  uint32_t *puVar1;
  internal_state *state;
  aec_stream *strm_local;
  
  if ((strm->bits_per_sample < 0x21) && (strm->bits_per_sample != 0)) {
    if ((strm->flags & 0x40) == 0) {
      if ((((strm->block_size != 8) && (strm->block_size != 0x10)) && (strm->block_size != 0x20)) &&
         (strm->block_size != 0x40)) {
        return -1;
      }
    }
    else if ((strm->block_size & 1) != 0) {
      return -1;
    }
    if (strm->rsi < 0x1001) {
      __s = (internal_state *)malloc(0x1b0);
      if (__s == (internal_state *)0x0) {
        strm_local._4_4_ = -4;
      }
      else {
        memset(__s,0,0x1b0);
        strm->state = __s;
        __s->uncomp_len = strm->block_size * strm->bits_per_sample;
        if (strm->bits_per_sample < 0x11) {
          if (strm->bits_per_sample < 9) {
            if ((strm->flags & 0x10) == 0) {
              __s->id_len = 3;
            }
            else {
              if (4 < strm->bits_per_sample) {
                return -1;
              }
              if (strm->bits_per_sample < 3) {
                __s->id_len = 1;
              }
              else {
                __s->id_len = 2;
              }
            }
            __s->bytes_per_sample = 1;
            __s->get_sample = aec_get_8;
            __s->get_rsi = aec_get_rsi_8;
          }
          else {
            __s->id_len = 4;
            __s->bytes_per_sample = 2;
            if ((strm->flags & 4) == 0) {
              __s->get_sample = aec_get_lsb_16;
              __s->get_rsi = aec_get_rsi_lsb_16;
            }
            else {
              __s->get_sample = aec_get_msb_16;
              __s->get_rsi = aec_get_rsi_msb_16;
            }
          }
        }
        else {
          __s->id_len = 5;
          if ((strm->bits_per_sample < 0x19) && ((strm->flags & 2) != 0)) {
            __s->bytes_per_sample = 3;
            if ((strm->flags & 4) == 0) {
              __s->get_sample = aec_get_lsb_24;
              __s->get_rsi = aec_get_rsi_lsb_24;
            }
            else {
              __s->get_sample = aec_get_msb_24;
              __s->get_rsi = aec_get_rsi_msb_24;
            }
          }
          else {
            __s->bytes_per_sample = 4;
            if ((strm->flags & 4) == 0) {
              __s->get_sample = aec_get_lsb_32;
              __s->get_rsi = aec_get_rsi_lsb_32;
            }
            else {
              __s->get_sample = aec_get_msb_32;
              __s->get_rsi = aec_get_rsi_msb_32;
            }
          }
        }
        __s->rsi_len = strm->rsi * strm->block_size * __s->bytes_per_sample;
        if ((strm->flags & 1) == 0) {
          __s->xmax = (int)(1L << ((byte)strm->bits_per_sample & 0x3f)) - 1;
          __s->xmin = 0;
          __s->preprocess = preprocess_unsigned;
        }
        else {
          __s->xmax = (int)(1L << ((char)strm->bits_per_sample - 1U & 0x3f)) - 1;
          __s->xmin = __s->xmax ^ 0xffffffff;
          __s->preprocess = preprocess_signed;
        }
        __s->kmax = (1 << ((byte)__s->id_len & 0x1f)) + -3;
        puVar1 = (uint32_t *)malloc((ulong)(strm->rsi * strm->block_size) << 2);
        __s->data_pp = puVar1;
        if (__s->data_pp == (uint32_t *)0x0) {
          cleanup((EVP_PKEY_CTX *)strm);
          strm_local._4_4_ = -4;
        }
        else {
          if ((strm->flags & 8) == 0) {
            __s->data_raw = __s->data_pp;
          }
          else {
            puVar1 = (uint32_t *)malloc((ulong)(strm->rsi * strm->block_size) << 2);
            __s->data_raw = puVar1;
            if (__s->data_raw == (uint32_t *)0x0) {
              cleanup((EVP_PKEY_CTX *)strm);
              return -4;
            }
          }
          __s->block = __s->data_pp;
          __s->ref = 0;
          strm->total_in = 0;
          strm->total_out = 0;
          __s->flushed = 0;
          __s->cds = __s->cds_buf;
          *__s->cds = '\0';
          __s->bits = 8;
          __s->mode = m_get_block;
          __s->ready_to_capture_rsi = 0;
          strm_local._4_4_ = 0;
        }
      }
    }
    else {
      strm_local._4_4_ = -1;
    }
  }
  else {
    strm_local._4_4_ = -1;
  }
  return strm_local._4_4_;
}

Assistant:

int aec_encode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    if (strm->flags & AEC_NOT_ENFORCE) {
        /* All even block sizes are allowed. */
        if (strm->block_size & 1)
            return AEC_CONF_ERROR;
    } else {
        /* Only allow standard conforming block sizes */
        if (strm->block_size != 8
            && strm->block_size != 16
            && strm->block_size != 32
            && strm->block_size != 64)
            return AEC_CONF_ERROR;
    }

    if (strm->rsi > 4096)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;

    memset(state, 0, sizeof(struct internal_state));
    strm->state = state;
    state->uncomp_len = strm->block_size * strm->bits_per_sample;

    if (strm->bits_per_sample > 16) {
        /* 24/32 input bit settings */
        state->id_len = 5;

        if (strm->bits_per_sample <= 24
            && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_24;
                state->get_rsi = aec_get_rsi_msb_24;
            } else {
                state->get_sample = aec_get_lsb_24;
                state->get_rsi = aec_get_rsi_lsb_24;
            }
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_32;
                state->get_rsi = aec_get_rsi_msb_32;
            } else {
                state->get_sample = aec_get_lsb_32;
                state->get_rsi = aec_get_rsi_lsb_32;
            }
        }
    }
    else if (strm->bits_per_sample > 8) {
        /* 16 bit settings */
        state->id_len = 4;
        state->bytes_per_sample = 2;

        if (strm->flags & AEC_DATA_MSB) {
            state->get_sample = aec_get_msb_16;
            state->get_rsi = aec_get_rsi_msb_16;
        } else {
            state->get_sample = aec_get_lsb_16;
            state->get_rsi = aec_get_rsi_lsb_16;
        }
    } else {
        /* 8 bit settings */
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }
        state->bytes_per_sample = 1;

        state->get_sample = aec_get_8;
        state->get_rsi = aec_get_rsi_8;
    }
    state->rsi_len = strm->rsi * strm->block_size * state->bytes_per_sample;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = (INT64_C(1) << (strm->bits_per_sample - 1)) - 1;
        state->xmin = ~state->xmax;
        state->preprocess = preprocess_signed;
    } else {
        state->xmax = (UINT64_C(1) << strm->bits_per_sample) - 1;
        state->xmin = 0;
        state->preprocess = preprocess_unsigned;
    }

    state->kmax = (1U << state->id_len) - 3;

    state->data_pp = malloc(strm->rsi
                            * strm->block_size
                            * sizeof(uint32_t));
    if (state->data_pp == NULL) {
        cleanup(strm);
        return AEC_MEM_ERROR;
    }

    if (strm->flags & AEC_DATA_PREPROCESS) {
        state->data_raw = malloc(strm->rsi
                                 * strm->block_size
                                 * sizeof(uint32_t));
        if (state->data_raw == NULL) {
            cleanup(strm);
            return AEC_MEM_ERROR;
        }
    } else {
        state->data_raw = state->data_pp;
    }

    state->block = state->data_pp;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    state->flushed = 0;

    state->cds = state->cds_buf;
    *state->cds = 0;
    state->bits = 8;
    state->mode = m_get_block;
    state->ready_to_capture_rsi = 0;
    return AEC_OK;
}